

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getEncodeMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  StringPtr version;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr title;
  StringPtr title_00;
  MainFunc MVar2;
  StringPtr briefDescription;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr argumentTitle;
  MainBuilder builder;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_138;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_128;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_118;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_108;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_f8;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_e8;
  char *local_d8;
  undefined8 uStack_d0;
  OptionName local_c8;
  OptionName local_b8;
  char *local_a8;
  undefined8 uStack_a0;
  OptionName local_98;
  undefined1 local_88;
  char *local_80;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:236:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:236:30)>
  local_78;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:235:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:235:33)>
  local_68;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:234:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:234:40)>
  local_58;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:229:48),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:229:48)>
  local_48;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:224:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:224:40)>
  local_38;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:221:33),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:221:33)>
  local_28;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_a8 = 
  "Note that the current implementation reads the entire input into memory before beginning to encode.  A better implementation would read and encode one message at a time."
  ;
  uStack_a0 = 0xaa;
  extendedDescription.content.size_ = 0xaa;
  extendedDescription.content.ptr =
       "Note that the current implementation reads the entire input into memory before beginning to encode.  A better implementation would read and encode one message at a time."
  ;
  version.content.size_ = 0x1e;
  version.content.ptr = "Cap\'n Proto version (unknown)";
  briefDescription.content.size_ = 0x1dc;
  briefDescription.content.ptr =
       "Encodes one or more textual Cap\'n Proto messages to binary.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input.  Each message is a parenthesized struct literal, like the format used to specify constants and default values of struct type in the schema language.  For example:\n    (foo = 123, bar = \"hello\", baz = [true, false, true])\nThe input may contain any number of such values; each will be encoded as a separate message."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  local_b8.isLong = true;
  local_b8.field_1.longName = "flat";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_e8,&local_28);
  names._M_len = 1;
  names._M_array = &local_b8;
  helpText_00.content.size_ = 0x59;
  helpText_00.content.ptr =
       "Expect only one input value, serializing it as a single-segment message with no framing.";
  pMVar1 = kj::MainBuilder::addOption
                     (&builder,names,(Function<kj::MainBuilder::Validity_()> *)&local_e8,helpText_00
                     );
  local_98.isLong = false;
  local_98.field_1.shortName = 'p';
  local_88 = 1;
  local_80 = "packed";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_f8,&local_38);
  names_00._M_len = 2;
  names_00._M_array = &local_98;
  helpText_01.content.size_ = 0xff;
  helpText_01.content.ptr =
       "Pack the output message with standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This writes messages using capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without this, capnp::writeMessage() from <capnp/serialize.h> is used.)"
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_f8,
                      helpText_01);
  local_c8.isLong = true;
  local_c8.field_1.longName = "segment-size";
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_108,&local_48);
  local_d8 = 
  "Sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  uStack_d0 = 0xd1;
  helpText.content.size_ = 0xd1;
  helpText.content.ptr =
       "Sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  names_01._M_len = 1;
  names_01._M_array = &local_c8;
  argumentTitle.content.size_ = 4;
  argumentTitle.content.ptr = "<n>";
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names_01,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_108,
                      argumentTitle,helpText);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_118,&local_58);
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_118
                     );
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_128,&local_68);
  title_00.content.size_ = 7;
  title_00.content.ptr = "<type>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title_00,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_128);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_138,&local_78);
  kj::MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_138);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_138);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_128);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_118);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_108);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_f8);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_e8);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&builder);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getEncodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Encodes one or more textual Cap'n Proto messages to binary.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input.  Each "
          "message is a parenthesized struct literal, like the format used to specify constants "
          "and default values of struct type in the schema language.  For example:\n"
          "    (foo = 123, bar = \"hello\", baz = [true, false, true])\n"
          "The input may contain any number of such values; each will be encoded as a separate "
          "message.",

          "Note that the current implementation reads the entire input into memory before "
          "beginning to encode.  A better implementation would read and encode one message at "
          "a time.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Expect only one input value, serializing it as a single-segment message "
                      "with no framing.")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Pack the output message with standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This writes messages using "
                      "capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without "
                      "this, capnp::writeMessage() from <capnp/serialize.h> is used.)")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
                             "Sets the preferred segment size on the MallocMessageBuilder to <n> "
                             "words and turns off heuristic growth.  This flag is mainly useful "
                             "for testing.  Without it, each message will be written as a single "
                             "segment.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, encode));
    return builder.build();
  }